

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miam-core.c
# Opt level: O3

void la_miam_core_v2_ack_format_json(la_vstring *vstr,void *data)

{
  ulong val;
  char *key;
  
  val = (ulong)*(ushort *)((long)data + 8);
  if (val == 0) {
    la_json_append_int64(vstr,"msg_ack_num",(ulong)*(byte *)((long)data + 0x10));
    val = (ulong)*(byte *)((long)data + 0x11);
    key = "ack_xfer_result";
  }
  else {
    key = "err";
  }
  la_json_append_int64(vstr,key,val);
  return;
}

Assistant:

static void la_miam_core_v2_ack_format_json(la_vstring *vstr, void const *data) {
	la_assert(vstr != NULL);
	la_assert(data != NULL);

	la_miam_core_v2_ack_pdu const *pdu = data;
	if(pdu->err & LA_MIAM_ERR_HDR) {
		la_miam_errors_format_json(vstr, pdu->err & LA_MIAM_ERR_HDR);
		return;
	}
	la_json_append_int64(vstr, "msg_ack_num", pdu->msg_ack_num);
	la_json_append_int64(vstr, "ack_xfer_result", pdu->ack_xfer_result);
}